

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::table_name_collector::operator()
          (table_name_collector *this,statement_type param_1,string *alias)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  type_index local_30;
  
  if ((this->find_table_name).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_30._M_target = (type_info *)&relive::Track::typeinfo;
    (*(this->find_table_name)._M_invoker)(&local_90,(_Any_data *)this,&local_30);
    paVar2 = &local_70.first.field_2;
    paVar3 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar3) {
      local_70.first.field_2._8_8_ = local_90.field_2._8_8_;
      local_70.first._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_70.first._M_dataplus._M_p = local_90._M_dataplus._M_p;
    }
    local_70.first.field_2._M_allocated_capacity._1_7_ =
         local_90.field_2._M_allocated_capacity._1_7_;
    local_70.first.field_2._M_local_buf[0] = local_90.field_2._M_local_buf[0];
    paVar4 = &local_70.second.field_2;
    local_70.first._M_string_length = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_70.second._M_dataplus._M_p = (alias->_M_dataplus)._M_p;
    paVar1 = &alias->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p == paVar1) {
      local_70.second.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_70.second.field_2._8_8_ = *(undefined8 *)((long)&alias->field_2 + 8);
      local_70.second._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_70.second.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_70.second._M_string_length = alias->_M_string_length;
    (alias->_M_dataplus)._M_p = (pointer)paVar1;
    alias->_M_string_length = 0;
    (alias->field_2)._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar3;
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->table_names,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != paVar4) {
      operator_delete(local_70.second._M_dataplus._M_p,
                      local_70.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.first._M_dataplus._M_p,
                      local_70.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar3) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void move_tuple(L &lhs, R &rhs) {
    using bool_type = std::integral_constant<bool, N != 0>;
    static_if<bool_type{}>([](auto &l, auto &r) {
      tuple_helper::move_tuple_impl<N, 0>(l, r);
    })(lhs, rhs);
}